

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O3

VmConstant * CreateConstantLong(Allocator *allocator,SynBase *source,longlong value)

{
  int iVar1;
  undefined4 extraout_var;
  VmConstant *pVVar2;
  
  iVar1 = (*allocator->_vptr_Allocator[2])(allocator,0xd8);
  pVVar2 = (VmConstant *)CONCAT44(extraout_var,iVar1);
  (pVVar2->super_VmValue).typeID = 1;
  (pVVar2->super_VmValue).type.type = VM_TYPE_LONG;
  (pVVar2->super_VmValue).type.size = 8;
  (pVVar2->super_VmValue).type.structType = (TypeBase *)0x0;
  (pVVar2->super_VmValue).source = source;
  (pVVar2->super_VmValue).comment.begin = (char *)0x0;
  (pVVar2->super_VmValue).comment.end = (char *)0x0;
  (pVVar2->super_VmValue).users.allocator = allocator;
  (pVVar2->super_VmValue).users.data = (pVVar2->super_VmValue).users.little;
  (pVVar2->super_VmValue).users.count = 0;
  (pVVar2->super_VmValue).users.max = 8;
  (pVVar2->super_VmValue).hasKnownNonSimpleUse = false;
  (pVVar2->super_VmValue).hasSideEffects = false;
  (pVVar2->super_VmValue).hasMemoryAccess = false;
  (pVVar2->super_VmValue).canBeRemoved = true;
  (pVVar2->super_VmValue).hasKnownSimpleUse = false;
  (pVVar2->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmValue_00241d38;
  pVVar2->iValue = 0;
  pVVar2->dValue = 0.0;
  pVVar2->lValue = 0;
  pVVar2->sValue = (char *)0x0;
  pVVar2->bValue = (VmBlock *)0x0;
  pVVar2->fValue = (VmFunction *)0x0;
  pVVar2->container = (VariableData *)0x0;
  pVVar2->isFloat = false;
  pVVar2->isReference = false;
  pVVar2->lValue = value;
  return pVVar2;
}

Assistant:

VmConstant* CreateConstantLong(Allocator *allocator, SynBase *source, long long value)
{
	VmConstant *result = new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Long, source);

	result->lValue = value;

	return result;
}